

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadAddress
          (BinaryReader *this,Address *out_value,Index memory,char *desc)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  uint local_34;
  char *pcStack_30;
  uint32_t val;
  char *desc_local;
  Address *pAStack_20;
  Index memory_local;
  Address *out_value_local;
  BinaryReader *this_local;
  Result res;
  
  pcStack_30 = desc;
  desc_local._4_4_ = memory;
  pAStack_20 = out_value;
  out_value_local = &this->read_end_;
  sVar2 = std::vector<wabt::Limits,_std::allocator<wabt::Limits>_>::size(&this->memories);
  uVar1 = desc_local._4_4_;
  if (memory < sVar2) {
    pvVar3 = std::vector<wabt::Limits,_std::allocator<wabt::Limits>_>::operator[]
                       (&this->memories,(ulong)desc_local._4_4_);
    if ((pvVar3->is_64 & 1U) == 0) {
      this_local._4_4_ = ReadU32Leb128(this,&local_34,pcStack_30);
      *pAStack_20 = (ulong)local_34;
    }
    else {
      this_local._4_4_ = ReadU64Leb128(this,pAStack_20,pcStack_30);
    }
  }
  else {
    sVar2 = std::vector<wabt::Limits,_std::allocator<wabt::Limits>_>::size(&this->memories);
    PrintError(this,"load/store memory %u out of range %lu",(ulong)uVar1,sVar2);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadAddress(Address* out_value,
                                 Index memory,
                                 const char* desc) {
  ERROR_UNLESS(memory < memories.size(),
               "load/store memory %u out of range %lu", memory,
               memories.size());
  if (memories[memory].is_64) {
    return ReadU64Leb128(out_value, desc);
  } else {
    uint32_t val;
    Result res = ReadU32Leb128(&val, desc);
    *out_value = val;
    return res;
  }
}